

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O2

int Dch_NodesAreEqual(void *p,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  uint *puVar1;
  uint *puVar2;
  void *pvVar3;
  void *pvVar4;
  uint *puVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  
  pvVar3 = Vec_PtrEntry((Vec_Ptr_t *)p,1);
  uVar7 = 0;
  pvVar4 = Vec_PtrEntry((Vec_Ptr_t *)p,0);
  uVar8 = (ulong)((long)pvVar3 - (long)pvVar4) >> 2;
  puVar5 = Dch_ObjSim((Vec_Ptr_t *)p,pObj0);
  puVar6 = Dch_ObjSim((Vec_Ptr_t *)p,pObj1);
  if (0 < (int)uVar8) {
    uVar7 = uVar8 & 0xffffffff;
  }
  if (((*(uint *)&pObj1->field_0x18 ^ *(uint *)&pObj0->field_0x18) & 8) == 0) {
    uVar8 = 0;
    do {
      if (uVar7 == uVar8) {
        return 1;
      }
      puVar1 = puVar5 + uVar8;
      puVar2 = puVar6 + uVar8;
      uVar8 = uVar8 + 1;
    } while (*puVar1 == *puVar2);
  }
  else {
    uVar8 = 0;
    do {
      if (uVar7 == uVar8) {
        return 1;
      }
      puVar1 = puVar6 + uVar8;
      puVar2 = puVar5 + uVar8;
      uVar8 = uVar8 + 1;
    } while ((*puVar1 ^ *puVar2) == 0xffffffff);
  }
  return 0;
}

Assistant:

int Dch_NodesAreEqual( void * p, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Vec_Ptr_t * vSims = (Vec_Ptr_t *)p;
    unsigned * pSim0, * pSim1;
    int k, nWords;
    nWords = (unsigned *)Vec_PtrEntry(vSims, 1) - (unsigned *)Vec_PtrEntry(vSims, 0);
    pSim0 = Dch_ObjSim( vSims, pObj0 );
    pSim1 = Dch_ObjSim( vSims, pObj1 );
    if ( pObj0->fPhase != pObj1->fPhase )
    {
        for ( k = 0; k < nWords; k++ )
            if ( pSim0[k] != ~pSim1[k] )
                return 0;
    }
    else
    {
        for ( k = 0; k < nWords; k++ )
            if ( pSim0[k] != pSim1[k] )
                return 0;
    }
    return 1;
}